

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O1

int luaH_next(lua_State *L,Table *t,StkId key)

{
  uint uVar1;
  TValue *pTVar2;
  long lVar3;
  Value VVar4;
  Node *n;
  Node *pNVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  TValue *io;
  
  uVar1 = luaH_realasize(t);
  uVar8 = 0;
  if (((key->val).tt_ & 0xf) != 0) {
    if (((key->val).tt_ == 3) &&
       (uVar8 = *(ulong *)key & 0xffffffff, *(ulong *)key - 1 >> 0x1f != 0)) {
      uVar8 = 0;
    }
    if (uVar1 <= (int)uVar8 - 1U) {
      pTVar2 = getgeneric(t,&key->val,1);
      if (pTVar2->tt_ == ' ') {
        luaG_runerror(L,"invalid key to \'next\'");
      }
      uVar8 = (ulong)(uVar1 + (int)((ulong)((long)pTVar2 - (long)t->node) >> 3) * -0x55555555 + 1);
    }
  }
  uVar6 = (uint)uVar8;
  uVar7 = uVar6;
  if (uVar6 < uVar1) {
    lVar3 = uVar8 << 4;
    do {
      uVar6 = uVar6 + 1;
      if (((&t->array->tt_)[lVar3] & 0xf) != 0) {
        *(ulong *)key = (ulong)uVar6;
        (key->val).tt_ = '\x03';
        pNVar5 = (Node *)((long)&t->array->value_ + lVar3);
        VVar4 = *(Value *)((long)&t->array->value_ + lVar3);
        goto LAB_0014f2cc;
      }
      lVar3 = lVar3 + 0x10;
      uVar7 = uVar1;
    } while (uVar6 != uVar1);
  }
  uVar6 = 1 << (t->lsizenode & 0x1f);
  uVar7 = uVar7 - uVar1;
  if ((int)uVar7 < (int)uVar6) {
    do {
      if ((*(byte *)((long)t->node + (ulong)uVar7 * 0x18 + 8) & 0xf) != 0) {
        pNVar5 = t->node + uVar7;
        (key->val).value_ = (pNVar5->u).key_val;
        (key->val).tt_ = (pNVar5->u).key_tt;
        VVar4 = (pNVar5->u).value_;
LAB_0014f2cc:
        key[1].val.value_ = VVar4;
        *(lu_byte *)((long)key + 0x18) = (pNVar5->u).tt_;
        return 1;
      }
      uVar7 = uVar7 + 1;
    } while (uVar6 != uVar7);
  }
  return 0;
}

Assistant:

int luaH_next (lua_State *L, Table *t, StkId key) {
  unsigned int asize = luaH_realasize(t);
  unsigned int i = findindex(L, t, s2v(key), asize);  /* find original key */
  for (; i < asize; i++) {  /* try first array part */
    if (!isempty(&t->array[i])) {  /* a non-empty entry? */
      setivalue(s2v(key), i + 1);
      setobj2s(L, key + 1, &t->array[i]);
      return 1;
    }
  }
  for (i -= asize; cast_int(i) < sizenode(t); i++) {  /* hash part */
    if (!isempty(gval(gnode(t, i)))) {  /* a non-empty entry? */
      Node *n = gnode(t, i);
      getnodekey(L, s2v(key), n);
      setobj2s(L, key + 1, gval(n));
      return 1;
    }
  }
  return 0;  /* no more elements */
}